

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::Generate
          (MessageBuilderGenerator *this,Printer *printer)

{
  _Rb_tree_header *p_Var1;
  OneofDescriptor *oneof;
  long lVar2;
  long lVar3;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  _Var4;
  char *buffer;
  bool bVar5;
  int iVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  LogMessage *pLVar9;
  long *plVar10;
  Descriptor *pDVar11;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar12;
  int iVar13;
  uint uVar14;
  java *this_00;
  long lVar15;
  long lVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  LogMessage local_c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  key_type local_50;
  
  WriteMessageDocComment(printer,this->descriptor_);
  pDVar11 = this->descriptor_;
  if (*(int *)(pDVar11 + 0x78) < 1) {
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&local_c0,this->name_resolver_,pDVar11,true);
    ExtraBuilderInterfaces_abi_cxx11_((string *)&vars,(java *)this->descriptor_,descriptor_00);
    local_e0.field_2._M_allocated_capacity._0_2_ = 0x3356;
    local_e0._M_string_length = 2;
    local_e0.field_2._M_local_buf[2] = '\0';
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    io::Printer::
    Print<char[10],std::__cxx11::string,char[17],std::__cxx11::string,char[4],std::__cxx11::string>
              (printer,
               "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage$ver$.Builder<Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
               ,(char (*) [10])0x3e9312,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
               (char (*) [17])"extra_interfaces",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars,
               (char (*) [4])0x3d9f76,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((_Base_ptr *)vars._M_t._M_impl._0_8_ !=
        &vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)vars._M_t._M_impl._0_8_);
    }
    if ((char *)local_c0._0_8_ == (char *)((long)&local_c0 + 0x10U)) goto LAB_002cd2ad;
  }
  else {
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&local_c0,this->name_resolver_,pDVar11,true);
    ExtraBuilderInterfaces_abi_cxx11_((string *)&vars,(java *)this->descriptor_,descriptor);
    local_e0.field_2._M_allocated_capacity._0_2_ = 0x3356;
    local_e0._M_string_length = 2;
    local_e0.field_2._M_local_buf[2] = '\0';
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    io::Printer::
    Print<char[10],std::__cxx11::string,char[17],std::__cxx11::string,char[4],std::__cxx11::string>
              (printer,
               "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage$ver$.ExtendableBuilder<\n      $classname$, Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
               ,(char (*) [10])0x3e9312,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
               (char (*) [17])"extra_interfaces",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars,
               (char (*) [4])0x3d9f76,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((_Base_ptr *)vars._M_t._M_impl._0_8_ !=
        &vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)vars._M_t._M_impl._0_8_);
    }
    if ((char *)local_c0._0_8_ == (char *)((long)&local_c0 + 0x10U)) goto LAB_002cd2ad;
  }
  operator_delete((void *)local_c0._0_8_);
LAB_002cd2ad:
  io::Printer::Indent(printer);
  GenerateDescriptorMethods(this,printer);
  GenerateCommonBuilderMethods(this,printer);
  bVar5 = Context::HasGeneratedMethods(this->context_,this->descriptor_);
  if (bVar5) {
    GenerateIsInitialized(this,printer);
    GenerateBuilderParsingMethods(this,printer);
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var8 = (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->oneofs_)._M_t._M_impl.super__Rb_tree_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    buffer = (char *)((long)&local_c0 + 0x10);
    do {
      oneof = *(OneofDescriptor **)(p_Var8 + 1);
      Context::GetOneofGeneratorInfo(this->context_,oneof);
      local_c0._0_8_ = buffer;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"oneof_name","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)&local_c0);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((char *)local_c0._0_8_ != buffer) {
        operator_delete((void *)local_c0._0_8_);
      }
      Context::GetOneofGeneratorInfo(this->context_,oneof);
      local_c0._0_8_ = buffer;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"oneof_capitalized_name","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)&local_c0);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((char *)local_c0._0_8_ != buffer) {
        operator_delete((void *)local_c0._0_8_);
      }
      local_c0._0_8_ = buffer;
      local_c0.filename_ =
           FastInt32ToBufferLeft
                     ((int)((ulong)((long)oneof - *(long *)(*(long *)(oneof + 0x10) + 0x30)) >> 3) *
                      -0x33333333,buffer);
      local_c0.filename_ = local_c0.filename_ + -(long)buffer;
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,local_c0._0_8_,local_c0.filename_ + local_c0._0_8_);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"oneof_index","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_50);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      io::Printer::Print(printer,&vars,
                         "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                        );
      io::Printer::Print(printer,&vars,
                         "public $oneof_capitalized_name$Case\n    get$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\npublic Builder clear$oneof_capitalized_name$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n"
                        );
      io::Printer::Print<>(printer,"  onChanged();\n");
      io::Printer::Print<>(printer,"  return this;\n}\n\n");
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  pDVar11 = this->descriptor_;
  if (0 < *(int *)(pDVar11 + 4)) {
    lVar16 = 0;
    lVar15 = 0;
    iVar13 = 0;
    do {
      lVar2 = *(long *)(pDVar11 + 0x28);
      if (*(Descriptor **)(lVar2 + 0x20 + lVar16) != (this->field_generators_).descriptor_) {
        internal::LogMessage::LogMessage
                  (&local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                   ,0x8a);
        pLVar9 = internal::LogMessage::operator<<
                           (&local_c0,"CHECK failed: (field->containing_type()) == (descriptor_): ")
        ;
        internal::LogFinisher::operator=((LogFinisher *)&local_e0,pLVar9);
        internal::LogMessage::~LogMessage(&local_c0);
      }
      if ((*(byte *)(lVar2 + 1 + lVar16) & 8) == 0) {
        plVar10 = (long *)(*(long *)(lVar2 + 0x20 + lVar16) + 0x28);
      }
      else {
        lVar3 = *(long *)(lVar2 + 0x28 + lVar16);
        if (lVar3 == 0) {
          plVar10 = (long *)(*(long *)(lVar2 + 0x10 + lVar16) + 0x70);
        }
        else {
          plVar10 = (long *)(lVar3 + 0x50);
        }
      }
      iVar6 = (**(code **)(*(long *)(this->field_generators_).field_generators_.
                                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [(int)((ulong)((lVar2 - *plVar10) + lVar16) >> 3) * 0x38e38e39].
                                    _M_t.
                                    super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                    ._M_t + 0x18))();
      iVar13 = iVar13 + iVar6;
      lVar15 = lVar15 + 1;
      pDVar11 = this->descriptor_;
      lVar16 = lVar16 + 0x48;
    } while (lVar15 < *(int *)(pDVar11 + 4));
    if (0 < iVar13) {
      this_00 = (java *)0x0;
      uVar12 = extraout_RDX;
      do {
        GetBitFieldName_abi_cxx11_((string *)&local_c0,this_00,(int)uVar12);
        io::Printer::Print<char[15],std::__cxx11::string>
                  (printer,"private int $bit_field_name$;\n",(char (*) [15])"bit_field_name",
                   (string *)&local_c0);
        uVar12 = extraout_RDX_00;
        if ((char *)local_c0._0_8_ != (char *)((long)&local_c0 + 0x10U)) {
          operator_delete((void *)local_c0._0_8_);
          uVar12 = extraout_RDX_01;
        }
        uVar14 = (int)this_00 + 1;
        this_00 = (java *)(ulong)uVar14;
      } while (iVar13 + 0x1fU >> 5 != uVar14);
      pDVar11 = this->descriptor_;
    }
  }
  if (0 < *(int *)(pDVar11 + 4)) {
    lVar15 = 0;
    lVar16 = 0;
    do {
      io::Printer::Print<>(printer,"\n");
      lVar2 = *(long *)(this->descriptor_ + 0x28);
      if (*(Descriptor **)(lVar2 + 0x20 + lVar15) != (this->field_generators_).descriptor_) {
        internal::LogMessage::LogMessage
                  (&local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                   ,0x8a);
        pLVar9 = internal::LogMessage::operator<<
                           (&local_c0,"CHECK failed: (field->containing_type()) == (descriptor_): ")
        ;
        internal::LogFinisher::operator=((LogFinisher *)&local_e0,pLVar9);
        internal::LogMessage::~LogMessage(&local_c0);
      }
      if ((*(byte *)(lVar2 + 1 + lVar15) & 8) == 0) {
        plVar10 = (long *)(*(long *)(lVar2 + 0x20 + lVar15) + 0x28);
      }
      else {
        lVar3 = *(long *)(lVar2 + 0x28 + lVar15);
        if (lVar3 == 0) {
          plVar10 = (long *)(*(long *)(lVar2 + 0x10 + lVar15) + 0x70);
        }
        else {
          plVar10 = (long *)(lVar3 + 0x50);
        }
      }
      _Var4._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
      _M_head_impl = (this->field_generators_).field_generators_.
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [(int)((ulong)((lVar2 - *plVar10) + lVar15) >> 3) * 0x38e38e39]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     ._M_t;
      (**(code **)(*(long *)_Var4._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                            ._M_head_impl + 0x30))
                (_Var4._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                 ._M_head_impl,printer);
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 0x48;
    } while (lVar16 < *(int *)(this->descriptor_ + 4));
  }
  io::Printer::Print<>
            (printer,
             "@java.lang.Override\npublic final Builder setUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return super.setUnknownFields(unknownFields);\n}\n\n@java.lang.Override\npublic final Builder mergeUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return super.mergeUnknownFields(unknownFields);\n}\n\n"
            );
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"\n// @@protoc_insertion_point(builder_scope:$full_name$)\n",
             (char (*) [10])0x3f3d96,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)(this->descriptor_ + 8) + 0x20));
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageBuilderGenerator::Generate(io::Printer* printer) {
  WriteMessageDocComment(printer, descriptor_);
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessage$ver$.ExtendableBuilder<\n"
        "      $classname$, Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "extra_interfaces", ExtraBuilderInterfaces(descriptor_), "ver",
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessage$ver$.Builder<Builder> "
        "implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "extra_interfaces", ExtraBuilderInterfaces(descriptor_), "ver",
        GeneratedCodeVersionSuffix());
  }
  printer->Indent();

  GenerateDescriptorMethods(printer);
  GenerateCommonBuilderMethods(printer);

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateBuilderParsingMethods(printer);
  }

  // oneof
  std::map<std::string, std::string> vars;
  for (auto oneof : oneofs_) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = StrCat(oneof->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // oneofCase() and clearOneof()
    printer->Print(vars,
                   "public $oneof_capitalized_name$Case\n"
                   "    get$oneof_capitalized_name$Case() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n"
                   "public Builder clear$oneof_capitalized_name$() {\n"
                   "  $oneof_name$Case_ = 0;\n"
                   "  $oneof_name$_ = null;\n");
    printer->Print("  onChanged();\n");
    printer->Print(
        "  return this;\n"
        "}\n"
        "\n");
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForBuilder();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateBuilderMembers(printer);
  }

  // Override methods declared in GeneratedMessage to return the concrete
  // generated type so callsites won't depend on GeneratedMessage. This
  // is needed to keep binary compatibility when we change generated code
  // to subclass a different GeneratedMessage class (e.g., in v3.0.0 release
  // we changed all generated code to subclass GeneratedMessageV3).
  printer->Print(
      "@java.lang.Override\n"
      "public final Builder setUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return super.setUnknownFields(unknownFields);\n"
      "}\n"
      "\n"
      "@java.lang.Override\n"
      "public final Builder mergeUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return super.mergeUnknownFields(unknownFields);\n"
      "}\n"
      "\n");

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(builder_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n");
}